

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void PushInterval(CostManager *manager,int64_t distance_cost,int position,int len)

{
  int iVar1;
  int end;
  int64_t *piVar2;
  CostCacheInterval *pCVar3;
  CostInterval *pCVar4;
  CostInterval *pCVar5;
  CostCacheInterval *pCVar6;
  bool bVar7;
  CostManager *pCVar8;
  CostInterval *interval_in;
  int start_new;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  
  if (len < 10) {
    if (0 < len) {
      piVar2 = manager->costs;
      lVar13 = (long)position;
      lVar12 = 4;
      do {
        lVar10 = manager->cost_cache[lVar12 + -4] + distance_cost;
        if (lVar10 < piVar2[lVar13]) {
          piVar2[lVar13] = lVar10;
          manager->dist_array[lVar13] = (short)lVar12 - 3;
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar13 < len + position);
    }
  }
  else if (manager->cache_intervals_size != 0) {
    pCVar3 = manager->cache_intervals;
    interval_in = manager->head;
    uVar11 = 0;
    do {
      iVar1 = pCVar3[uVar11].start;
      if (len <= iVar1) {
        return;
      }
      pCVar6 = pCVar3 + uVar11;
      iVar14 = pCVar6->end;
      if (len <= iVar14) {
        iVar14 = len;
      }
      iVar14 = iVar14 + position;
      lVar12 = pCVar6->cost + distance_cost;
      iVar1 = iVar1 + position;
      pCVar4 = interval_in;
      do {
        while( true ) {
          while( true ) {
            do {
              interval_in = pCVar4;
              iVar9 = iVar1;
              if (interval_in == (CostInterval *)0x0) {
                interval_in = (CostInterval *)0x0;
                goto LAB_0017c8a5;
              }
              end = interval_in->start;
              if (iVar14 <= end) goto LAB_0017c8a5;
              pCVar4 = interval_in->next;
              iVar9 = interval_in->end;
            } while (iVar9 <= iVar1);
            if (lVar12 < interval_in->cost) break;
            InsertInterval(manager,interval_in,lVar12,position,iVar1,end);
            iVar1 = iVar9;
            if (iVar14 <= iVar9) goto LAB_0017c8a5;
          }
          if (end < iVar1) break;
          if (iVar14 < iVar9) {
            interval_in->start = iVar14;
            iVar9 = iVar1;
            goto LAB_0017c8a5;
          }
          pCVar5 = interval_in->previous;
          pCVar8 = (CostManager *)&pCVar5->next;
          if (pCVar5 == (CostInterval *)0x0) {
            pCVar8 = manager;
          }
          pCVar8->head = pCVar4;
          if (pCVar4 != (CostInterval *)0x0) {
            pCVar4->previous = pCVar5;
          }
          bVar7 = manager->intervals + 9 < interval_in || interval_in < manager->intervals;
          pCVar5 = (&manager->free_intervals)[bVar7];
          (&manager->free_intervals)[bVar7] = interval_in;
          interval_in->next = pCVar5;
          manager->count = manager->count + -1;
        }
        interval_in->end = iVar1;
      } while (iVar9 <= iVar14);
      InsertInterval(manager,interval_in,interval_in->cost,interval_in->index,iVar14,iVar9);
      interval_in = interval_in->next;
      iVar9 = iVar1;
LAB_0017c8a5:
      InsertInterval(manager,interval_in,lVar12,position,iVar9,iVar14);
      uVar11 = uVar11 + 1;
    } while (uVar11 < manager->cache_intervals_size);
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     int64_t distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      int64_t cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = distance_cost + manager->cost_cache[k];

      if (manager->costs[j] > cost_tmp) {
        manager->costs[j] = cost_tmp;
        manager->dist_array[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size &&
              cost_cache_intervals[i].start < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start;
    const int end = position + (cost_cache_intervals[i].end > len
                                 ? len
                                 : cost_cache_intervals[i].end);
    const int64_t cost = distance_cost + cost_cache_intervals[i].cost;

    for (; interval != NULL && interval->start < end;
         interval = interval_next) {
      interval_next = interval->next;

      // Make sure we have some overlap
      if (start >= interval->end) continue;

      if (cost >= interval->cost) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start        interval->end
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start) {
        if (interval->end <= end) {
          //                   [----------------------------------[
          //                   interval->start        interval->end
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start          interval->end
          // [*****************************[
          // start                       end
          interval->start = end;
          break;
        }
      } else {
        if (end < interval->end) {
          // [--------------------------------------------------------------[
          // interval->start                                    interval->end
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end;
          interval->end = start;
          InsertInterval(manager, interval, interval->cost, interval->index,
                         end, end_original);
          interval = interval->next;
          break;
        } else {
          // [------------------------------------[
          // interval->start          interval->end
          //                     [*****************************[
          //                     start                       end
          interval->end = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}